

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O0

ssize_t archive_write_v7tar_data(archive_write *a,void *buff,size_t s)

{
  ulong *puVar1;
  int iVar2;
  int ret;
  v7tar *v7tar;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  puVar1 = (ulong *)a->format_data;
  v7tar = (v7tar *)s;
  if (*puVar1 < s) {
    v7tar = (v7tar *)*puVar1;
  }
  iVar2 = __archive_write_output(a,buff,(size_t)v7tar);
  *puVar1 = *puVar1 - (long)v7tar;
  if (iVar2 == 0) {
    a_local = (archive_write *)v7tar;
  }
  else {
    a_local = (archive_write *)(long)iVar2;
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
archive_write_v7tar_data(struct archive_write *a, const void *buff, size_t s)
{
	struct v7tar *v7tar;
	int ret;

	v7tar = (struct v7tar *)a->format_data;
	if (s > v7tar->entry_bytes_remaining)
		s = (size_t)v7tar->entry_bytes_remaining;
	ret = __archive_write_output(a, buff, s);
	v7tar->entry_bytes_remaining -= s;
	if (ret != ARCHIVE_OK)
		return (ret);
	return (s);
}